

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O2

void testMiscMatrixAlgo(void)

{
  float *pfVar1;
  float *pfVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint __line;
  ostream *poVar6;
  long lVar7;
  char *__assertion;
  int iVar8;
  bool bVar9;
  float fVar10;
  Rand48 random_1;
  V3f rOffset;
  V3f scaleB;
  V3f rotB;
  V3f rotA;
  V3f transB;
  M44f invS;
  M44f L;
  V3f tOffset;
  M44f invO;
  Rand48 random;
  M44f outInRefMat;
  V3f sOffset;
  V3f scaleA;
  M44f outMat;
  V3f transA_1;
  M44f refMat;
  
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing misc functions in ImathMatrixAlgo.h");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "Testing the building of an orthonormal direct frame from : a position, "
                          );
  poVar6 = std::operator<<(poVar6,"an x axis direction and a normal to the y axis");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"IMATH_INTERNAL_NAMESPACE::computeLocalFrame()");
  std::endl<char,std::char_traits<char>>(poVar6);
  random._state[0] = 0x5a5a;
  random._state[1] = 0x5a5a;
  random._state[2] = 0x5a5a;
  iVar8 = 0;
  while( true ) {
    if (iVar8 == 100000) {
      poVar6 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "Add a translate/rotate/scale offset to an input frame ");
      poVar6 = std::operator<<(poVar6,"and put it in another frame of reference");
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<((ostream *)&std::cout,"IMATH_INTERNAL_NAMESPACE::addOffset()");
      std::endl<char,std::char_traits<char>>(poVar6);
      random_1._state[0] = 0x5a5a;
      random_1._state[1] = 0x5a5a;
      random_1._state[2] = 0x5a5a;
      iVar8 = 100000;
      while( true ) {
        bVar9 = iVar8 == 0;
        iVar8 = iVar8 + -1;
        if (bVar9) break;
        anon_unknown.dwarf_a9832::createRandomMat(&L,&random_1,(V3f *)&random,&rotA,&scaleA);
        anon_unknown.dwarf_a9832::createRandomMat(&refMat,&random_1,&transB,&rotB,&scaleB);
        anon_unknown.dwarf_a9832::getRandTRS(&random_1,&tOffset,&rOffset,&sOffset);
        Imath_3_2::addOffset<float>(&outMat,&L,&tOffset,&rOffset,&sOffset,&refMat);
        invO.x[0][0] = 1.0;
        invO.x[0][1] = 0.0;
        invO.x[0][2] = 0.0;
        invO.x[0][3] = 0.0;
        invO.x[1][0] = 0.0;
        invO.x[1][1] = 1.0;
        invO.x[1][2] = 0.0;
        invO.x[1][3] = 0.0;
        invO.x[2][0] = 0.0;
        invO.x[2][1] = 0.0;
        invO.x[2][2] = 1.0;
        invO.x[2][3] = 0.0;
        invO.x[3][0] = 0.0;
        invO.x[3][1] = 0.0;
        invO.x[3][2] = 0.0;
        invO.x[3][3] = 1.0;
        invS.x[0][2] = rOffset.z * 0.017453292;
        invS.x[0][0] = rOffset.x * 0.017453292;
        invS.x[0][1] = rOffset.y * 0.017453292;
        Imath_3_2::Matrix44<float>::rotate<float>(&invO,(Vec3<float> *)&invS);
        invO.x[3][0] = tOffset.x;
        invO.x[3][1] = tOffset.y;
        invO.x[3][2] = tOffset.z;
        Imath_3_2::Matrix44<float>::invert(&invO);
        invS.x[0][0] = 1.0;
        invS.x[0][1] = 0.0;
        invS.x[0][2] = 0.0;
        invS.x[0][3] = 0.0;
        invS.x[1][0] = 0.0;
        invS.x[1][1] = 1.0;
        invS.x[1][2] = 0.0;
        invS.x[1][3] = 0.0;
        invS.x[2][0] = 0.0;
        invS.x[2][1] = 0.0;
        invS.x[2][2] = 1.0;
        invS.x[2][3] = 0.0;
        invS.x[3][0] = 0.0;
        invS.x[3][1] = 0.0;
        invS.x[3][2] = 0.0;
        invS.x[3][3] = 1.0;
        Imath_3_2::Matrix44<float>::scale<float>((Matrix44<float> *)&invS,&sOffset);
        Imath_3_2::Matrix44<float>::invert((Matrix44<float> *)&invS);
        Imath_3_2::Matrix44<float>::multiply(&invO,(Matrix44<float> *)&invS);
        Imath_3_2::Matrix44<float>::multiply((Matrix44<float> *)&transA_1,&outMat);
        Imath_3_2::Matrix44<float>::multiply(&L,&refMat);
        anon_unknown.dwarf_a9832::compareMat(&outInRefMat,(M44f *)&transA_1);
      }
      poVar6 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "Compute Translate/Rotate/Scale matrix from matrix A ");
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<((ostream *)&std::cout,"with the Rotate/Scale of Matrix B");
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<((ostream *)&std::cout,"IMATH_INTERNAL_NAMESPACE::computeRSMatrix()");
      std::endl<char,std::char_traits<char>>(poVar6);
      scaleB.x = 1.5365222e+16;
      scaleB.y._0_2_ = 0x5a5a;
      iVar8 = 100000;
      while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
        anon_unknown.dwarf_a9832::createRandomMat(&L,(Rand48 *)&scaleB,&transA_1,&transB,&rotB);
        anon_unknown.dwarf_a9832::createRandomMat
                  (&refMat,(Rand48 *)&scaleB,(V3f *)&random,&rotA,&scaleA);
        Imath_3_2::computeRSMatrix<float>(&outMat,true,true,&L,&refMat);
        Imath_3_2::computeRSMatrix<float>(&invO,false,false,&L,&refMat);
        Imath_3_2::computeRSMatrix<float>(&invS,true,false,&L,&refMat);
        Imath_3_2::computeRSMatrix<float>(&outInRefMat,false,true,&L,&refMat);
        anon_unknown.dwarf_a9832::testRSMatrix(&outMat,&transA_1,&transB,&rotB);
        anon_unknown.dwarf_a9832::testRSMatrix(&invO,&transA_1,&rotA,&scaleA);
        anon_unknown.dwarf_a9832::testRSMatrix(&invS,&transA_1,&transB,&scaleA);
        anon_unknown.dwarf_a9832::testRSMatrix(&outInRefMat,&transA_1,&rotA,&rotB);
      }
      poVar6 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar6);
      return;
    }
    dVar3 = Imath_3_2::Rand48::nextf(&random,-10.0,10.0);
    dVar4 = Imath_3_2::Rand48::nextf(&random,-10.0,10.0);
    dVar5 = Imath_3_2::Rand48::nextf(&random,-10.0,10.0);
    refMat.x[0][0] = (float)dVar3;
    refMat.x[0][2] = (float)dVar5;
    refMat.x[0][1] = (float)dVar4;
    dVar3 = Imath_3_2::Rand48::nextf(&random,-10.0,10.0);
    dVar4 = Imath_3_2::Rand48::nextf(&random,-10.0,10.0);
    dVar5 = Imath_3_2::Rand48::nextf(&random,-10.0,10.0);
    outMat.x[0][0] = (float)dVar3;
    outMat.x[0][2] = (float)dVar5;
    outMat.x[0][1] = (float)dVar4;
    dVar3 = Imath_3_2::Rand48::nextf(&random,-10.0,10.0);
    dVar4 = Imath_3_2::Rand48::nextf(&random,-10.0,10.0);
    dVar5 = Imath_3_2::Rand48::nextf(&random,-10.0,10.0);
    invO.x[0][0] = (float)dVar3;
    invO.x[0][2] = (float)dVar5;
    invO.x[0][1] = (float)dVar4;
    Imath_3_2::computeLocalFrame<float>
              (&L,(Vec3<float> *)&refMat,(Vec3<float> *)&outMat,(Vec3<float> *)&invO);
    lVar7 = 0;
    while (lVar7 != 3) {
      pfVar1 = L.x[3] + lVar7;
      pfVar2 = refMat.x[0] + lVar7;
      lVar7 = lVar7 + 1;
      if (5e-05 < ABS(*pfVar1 - *pfVar2)) {
        __assertion = "false";
        __line = 0x45;
        goto LAB_0013b20e;
      }
    }
    if (5e-05 < ABS(L.x[3][3] + -1.0)) break;
    invS.x[0][0] = L.x[0][0];
    invS.x[0][1] = L.x[0][1];
    invS.x[0][2] = L.x[0][2];
    outInRefMat.x[0][2] = outMat.x[0][1] * L.x[0][0] - L.x[0][1] * outMat.x[0][0];
    outInRefMat.x[0][1] = outMat.x[0][0] * L.x[0][2] - L.x[0][0] * outMat.x[0][2];
    outInRefMat.x[0][0] = outMat.x[0][2] * L.x[0][1] - L.x[0][2] * outMat.x[0][1];
    fVar10 = Imath_3_2::Vec3<float>::length((Vec3<float> *)&outInRefMat);
    if (5e-05 <= fVar10) {
      __assertion = "(x % xDir).length () < eps";
      __line = 0x4b;
      goto LAB_0013b20e;
    }
    if (5e-05 < ABS(L.x[0][3])) {
      __assertion = "false";
      __line = 0x4c;
      goto LAB_0013b20e;
    }
    fVar10 = Imath_3_2::Vec3<float>::length((Vec3<float> *)&invS);
    if (5e-05 <= ABS(fVar10 + -1.0)) {
      __assertion = "(abs (x.length () - 1.f) < eps)";
      __line = 0x4d;
      goto LAB_0013b20e;
    }
    outInRefMat.x[0][0] = L.x[1][0];
    outInRefMat.x[0][1] = L.x[1][1];
    outInRefMat.x[0][2] = L.x[1][2];
    if (5e-05 < ABS(L.x[1][3])) {
      __assertion = "false";
      __line = 0x51;
      goto LAB_0013b20e;
    }
    if (5e-05 <= ABS(invS.x[0][2] * L.x[1][2] + invS.x[0][0] * L.x[1][0] + invS.x[0][1] * L.x[1][1])
       ) {
      __assertion = "abs (x ^ y) < eps";
      __line = 0x52;
      goto LAB_0013b20e;
    }
    if (5e-05 <= ABS(L.x[1][2] * invO.x[0][2] + invO.x[0][0] * L.x[1][0] + L.x[1][1] * invO.x[0][1])
       ) {
      __assertion = "abs (y ^ normalDir) < eps";
      __line = 0x56;
      goto LAB_0013b20e;
    }
    fVar10 = Imath_3_2::Vec3<float>::length((Vec3<float> *)&outInRefMat);
    if (5e-05 <= ABS(fVar10 + -1.0)) {
      __assertion = "(abs (y.length () - 1.f) < eps)";
      __line = 0x57;
      goto LAB_0013b20e;
    }
    transA_1.x = L.x[2][0];
    transA_1.y = L.x[2][1];
    transA_1.z = L.x[2][2];
    if (5e-05 < ABS(L.x[2][3])) {
      __assertion = "false";
      __line = 0x5b;
      goto LAB_0013b20e;
    }
    fVar10 = Imath_3_2::Vec3<float>::length(&transA_1);
    if (5e-05 <= ABS(fVar10 + -1.0)) {
      __assertion = "(abs (z.length () - 1.f) < eps)";
      __line = 0x5c;
      goto LAB_0013b20e;
    }
    if (5e-05 <= ABS(invS.x[0][2] * transA_1.z +
                     invS.x[0][0] * transA_1.x + invS.x[0][1] * transA_1.y)) {
      __assertion = "abs (x ^ z) < eps";
      __line = 0x5d;
      goto LAB_0013b20e;
    }
    if (5e-05 <= ABS(outInRefMat.x[0][2] * transA_1.z +
                     outInRefMat.x[0][0] * transA_1.x + transA_1.y * outInRefMat.x[0][1])) {
      __assertion = "abs (y ^ z) < eps";
      __line = 0x5e;
      goto LAB_0013b20e;
    }
    if ((invS.x[0][0] * outInRefMat.x[0][1] - outInRefMat.x[0][0] * invS.x[0][1]) * transA_1.z +
        (invS.x[0][1] * outInRefMat.x[0][2] - outInRefMat.x[0][1] * invS.x[0][2]) * transA_1.x +
        transA_1.y * (invS.x[0][2] * outInRefMat.x[0][0] - outInRefMat.x[0][2] * invS.x[0][0]) <=
        0.0) {
      __assertion = "((x % y) ^ z) > 0";
      __line = 0x5f;
      goto LAB_0013b20e;
    }
    iVar8 = iVar8 + 1;
  }
  __assertion = "false";
  __line = 0x47;
LAB_0013b20e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testMiscMatrixAlgo.cpp"
                ,__line,"void (anonymous namespace)::testComputeLocalFrame()");
}

Assistant:

void
testMiscMatrixAlgo ()
{
    try
    {
        cout << "Testing misc functions in ImathMatrixAlgo.h" << endl;

        cout
            << "Testing the building of an orthonormal direct frame from : a position, "
            << "an x axis direction and a normal to the y axis" << endl;
        cout << "IMATH_INTERNAL_NAMESPACE::computeLocalFrame()" << endl;

        testComputeLocalFrame ();

        cout << "ok\n" << endl;

        cout << "Add a translate/rotate/scale offset to an input frame "
             << "and put it in another frame of reference" << endl;
        cout << "IMATH_INTERNAL_NAMESPACE::addOffset()" << endl;

        testAddOffset ();

        cout << "ok\n" << endl;

        cout << "Compute Translate/Rotate/Scale matrix from matrix A " << endl;
        cout << "with the Rotate/Scale of Matrix B" << endl;
        cout << "IMATH_INTERNAL_NAMESPACE::computeRSMatrix()" << endl;

        testComputeRSMatrix ();

        cout << "ok\n" << endl;
    }
    catch (std::exception& e)
    {
        cerr << "  Caught exception: " << e.what () << endl;
    }
}